

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O1

bool __thiscall
cmQtAutoGeneratorMocUic::ParallelJobPushUic(cmQtAutoGeneratorMocUic *this,JobHandleT *jobHandle)

{
  JobT *pJVar1;
  JobT *pJVar2;
  _func_int **pp_Var3;
  int iVar4;
  _Elt_pointer puVar5;
  pthread_mutex_t *__mutex;
  bool bVar6;
  bool bVar7;
  string error;
  string local_c0;
  pthread_mutex_t *local_a0;
  cmQtAutoGeneratorMocUic *local_98;
  string *local_90;
  string *local_88;
  _Map_pointer local_80;
  _Elt_pointer local_78;
  string local_70;
  JobHandleT *local_50;
  Logger *local_48;
  string *local_40;
  _Elt_pointer local_38;
  
  __mutex = (pthread_mutex_t *)&this->JobsMutex_;
  iVar4 = pthread_mutex_lock(__mutex);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  if (this->JobThreadsAbort_ == false) {
    puVar5 = (this->JobQueues_).Uic.
             super__Deque_base<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_38 = (this->JobQueues_).Uic.
               super__Deque_base<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (puVar5 != local_38) {
      local_78 = (this->JobQueues_).Uic.
                 super__Deque_base<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last;
      local_80 = (this->JobQueues_).Uic.
                 super__Deque_base<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node;
      pJVar1 = (jobHandle->_M_t).
               super___uniq_ptr_impl<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
               .super__Head_base<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_false>._M_head_impl;
      local_88 = (string *)(pJVar1 + 9);
      local_90 = (string *)(pJVar1 + 1);
      local_40 = (string *)(pJVar1 + 5);
      local_48 = &(this->super_cmQtAutoGenerator).Logger_;
      bVar6 = true;
      local_a0 = __mutex;
      local_98 = this;
      local_50 = jobHandle;
      do {
        pJVar2 = (puVar5->_M_t).
                 super___uniq_ptr_impl<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
                 .super__Head_base<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_false>._M_head_impl;
        pp_Var3 = pJVar2[10]._vptr_JobT;
        if (pp_Var3 == pJVar1[10]._vptr_JobT) {
          if (pp_Var3 == (_func_int **)0x0) {
            bVar7 = true;
          }
          else {
            iVar4 = bcmp(pJVar2[9]._vptr_JobT,(local_88->_M_dataplus)._M_p,(size_t)pp_Var3);
            bVar7 = iVar4 == 0;
          }
        }
        else {
          bVar7 = false;
        }
        if (bVar7) {
          pp_Var3 = pJVar2[2]._vptr_JobT;
          if (pp_Var3 == pJVar1[2]._vptr_JobT) {
            if (pp_Var3 != (_func_int **)0x0) {
              iVar4 = bcmp((((string *)(pJVar2 + 1))->_M_dataplus)._M_p,(local_90->_M_dataplus)._M_p
                           ,(size_t)pp_Var3);
              if (iVar4 != 0) goto LAB_0019bba7;
            }
          }
          else {
LAB_0019bba7:
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_70,"The two source files\n  ","");
            cmQtAutoGen::Quoted(&local_c0,local_40);
            std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_c0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append((char *)&local_70);
            cmQtAutoGen::Quoted(&local_c0,(string *)(pJVar2 + 5));
            std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_c0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append((char *)&local_70);
            cmQtAutoGen::Quoted(&local_c0,local_88);
            std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_c0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append((char *)&local_70);
            cmQtAutoGen::Quoted(&local_c0,local_90);
            std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_c0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append((char *)&local_70);
            cmQtAutoGen::Quoted(&local_c0,(string *)(pJVar2 + 1));
            std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_c0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append((char *)&local_70);
            cmQtAutoGenerator::Logger::Error(local_48,UIC,&local_70);
            RegisterJobError(local_98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
          }
          bVar6 = false;
        }
        if (bVar7) break;
        puVar5 = puVar5 + 1;
        if (puVar5 == local_78) {
          puVar5 = local_80[1];
          local_80 = local_80 + 1;
          local_78 = puVar5 + 0x40;
        }
      } while (puVar5 != local_38);
      this = local_98;
      __mutex = local_a0;
      jobHandle = local_50;
      if (!bVar6) goto LAB_0019bde4;
    }
    std::
    deque<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>,std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>>>
    ::
    emplace_back<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>>
              ((deque<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>,std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>>>
                *)&(this->JobQueues_).Uic,jobHandle);
  }
LAB_0019bde4:
  bVar6 = this->JobError_;
  pthread_mutex_unlock(__mutex);
  return (bool)(bVar6 ^ 1);
}

Assistant:

bool cmQtAutoGeneratorMocUic::ParallelJobPushUic(JobHandleT& jobHandle)
{
  std::lock_guard<std::mutex> jobsLock(JobsMutex_);
  if (!JobThreadsAbort_) {
    bool pushJobHandle = true;
    // Look for include collisions.
    const JobUicT& uicJob(static_cast<JobUicT&>(*jobHandle));
    for (const JobHandleT& otherHandle : JobQueues_.Uic) {
      const JobUicT& otherJob(static_cast<JobUicT&>(*otherHandle));
      if (otherJob.IncludeString == uicJob.IncludeString) {
        // Check if the same uic file would be generated from different
        // source files which would be an error.
        if (otherJob.SourceFile != uicJob.SourceFile) {
          // Include string collision
          std::string error = "The two source files\n  ";
          error += Quoted(uicJob.IncluderFile);
          error += " and\n  ";
          error += Quoted(otherJob.IncluderFile);
          error += "\ncontain the same uic include string ";
          error += Quoted(uicJob.IncludeString);
          error += "\nbut the uic file would be generated from different "
                   "source files\n  ";
          error += Quoted(uicJob.SourceFile);
          error += " and\n  ";
          error += Quoted(otherJob.SourceFile);
          error +=
            ".\nConsider to\n"
            "- add a directory prefix to a \"ui_<NAME>.h\" include "
            "(e.g \"sub/ui_<NAME>.h\")\n"
            "- rename the <NAME>.ui file(s) and adjust the \"ui_<NAME>.h\" "
            "include(s)\n";
          Log().Error(GenT::UIC, error);
          RegisterJobError();
        }
        // Do not push this job in since the uic file already
        // gets generated by an other job.
        pushJobHandle = false;
        break;
      }
    }
    if (pushJobHandle) {
      JobQueues_.Uic.emplace_back(std::move(jobHandle));
    }
  }
  return !JobError_;
}